

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lowLevelIoExamples.cpp
# Opt level: O3

void writeRgbaFILE(FILE *cfile,char *fileName,Rgba *pixels,int width,int height)

{
  int iVar1;
  RgbaOutputFile file;
  C_OStream ostr;
  Rgba local_b0 [3];
  undefined8 local_98;
  undefined **local_90 [5];
  FILE *local_68;
  Header local_60 [56];
  
  Imf_3_2::OStream::OStream((OStream *)local_90,fileName);
  local_90[0] = &PTR__OStream_00110cd8;
  local_98 = 0;
  local_68 = cfile;
  Imf_3_2::Header::Header((Header *)0x3f800000,0x3f800000,local_60,width,height,&local_98,0,3);
  iVar1 = Imf_3_2::globalThreadCount();
  Imf_3_2::RgbaOutputFile::RgbaOutputFile
            ((RgbaOutputFile *)local_b0,(OStream *)local_90,local_60,WRITE_RGBA,iVar1);
  Imf_3_2::Header::~Header(local_60);
  Imf_3_2::RgbaOutputFile::setFrameBuffer(local_b0,(ulong)pixels,1);
  Imf_3_2::RgbaOutputFile::writePixels((int)local_b0);
  Imf_3_2::RgbaOutputFile::~RgbaOutputFile((RgbaOutputFile *)local_b0);
  Imf_3_2::OStream::~OStream((OStream *)local_90);
  return;
}

Assistant:

void
writeRgbaFILE (
    FILE*       cfile,
    const char  fileName[],
    const Rgba* pixels,
    int         width,
    int         height)
{
    //
    // Store an RGBA image in a C stdio file that has already been opened:
    //
    //	- create a C_OStream object for writing to the file
    //	- create an RgbaOutputFile object, and attach it to the C_OStream
    //	- describe the memory layout of the pixels
    //	- store the pixels in the file
    //

    C_OStream      ostr (cfile, fileName);
    RgbaOutputFile file (ostr, Header (width, height), WRITE_RGBA);
    file.setFrameBuffer (pixels, 1, width);
    file.writePixels (height);
}